

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  
  lVar2 = (long)end - (long)ptr;
  if (lVar2 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar4 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar4 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_00646fd2:
        bVar4 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar4 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_00646fd2;
    bVar4 = 0;
  }
  iVar5 = 0;
  if (bVar4 < 0x15) {
    if (1 < bVar4 - 9) {
      if (bVar4 == 6) {
        if (lVar2 == 2) {
          return -2;
        }
      }
      else if ((bVar4 == 7) && (lVar2 < 4)) {
        return -2;
      }
      goto switchD_00647002_caseD_17;
    }
switchD_00647002_caseD_15:
    iVar5 = 0x16;
  }
  else {
    switch(bVar4) {
    case 0x15:
    case 0x1e:
      goto switchD_00647002_caseD_15;
    case 0x16:
    case 0x18:
switchD_00647002_caseD_16:
      lVar2 = lVar2 + -2;
      if (lVar2 < 2) {
        return -1;
      }
      ptr = ptr + 4;
LAB_00647064:
      bVar1 = ptr[-2];
      if (bVar1 < 0xdc) {
        cVar3 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[-1]);
          }
          else {
LAB_006470b5:
            cVar3 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar3 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || ((byte)ptr[-1] < 0xfe)) goto LAB_006470b5;
        cVar3 = '\0';
      }
      switch(cVar3) {
      case '\x12':
        iVar5 = 0x1c;
        goto switchD_00647002_caseD_17;
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
      case '\x1c':
        break;
      case '\x16':
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1b':
        goto switchD_006470d1_caseD_16;
      case '\x1d':
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)ptr[-1] & 0x1f) & 1) != 0) goto switchD_006470d1_caseD_16;
        break;
      default:
        if (cVar3 == '\x06') {
          if (lVar2 == 2) {
            return -2;
          }
        }
        else if ((cVar3 == '\a') && (lVar2 < 4)) {
          return -2;
        }
      }
      ptr = ptr + -2;
      break;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                    ) >> ((byte)ptr[1] & 0x1f) & 1) != 0) goto switchD_00647002_caseD_16;
    }
  }
switchD_00647002_caseD_17:
  *nextTokPtr = ptr;
  return iVar5;
switchD_006470d1_caseD_16:
  lVar2 = lVar2 + -2;
  ptr = ptr + 2;
  if (lVar2 < 2) {
    return -1;
  }
  goto LAB_00647064;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}